

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

double __thiscall despot::Chain::Reward(Chain *this,int s1,ACT_TYPE action,int s2)

{
  int iVar1;
  int s2_local;
  ACT_TYPE action_local;
  int s1_local;
  Chain *this_local;
  
  if (s2 == 0) {
    this_local = (Chain *)0x4000000000000000;
  }
  else {
    iVar1 = 0;
    if (s1 == s2 && s2 == 4) {
      iVar1 = 10;
    }
    this_local = (Chain *)(double)iVar1;
  }
  return (double)this_local;
}

Assistant:

double Chain::Reward(int s1, ACT_TYPE action, int s2) const {
	/*
	 if (action == ACTION_B)
	 return 2;
	 return s1 == 4 ? 10 : 0;
	 */
	if (s2 == 0) {
		return 2;
	} else
		return (s1 == s2 && s2 == NUM_MDP_STATES - 1) ? 10 : 0;
	//return s2 == NUM_MDP_STATES-1 ? 10 : 0;
}